

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_qnames(lysp_ctx *ctx,lysp_stmt *stmt,lysp_qname **qnames,yang_arg arg,
                       lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  lysp_qname *str_p;
  char *pcVar2;
  char *pcVar3;
  ly_ctx *local_a8;
  long local_a0;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  lysp_stmt *plStack_60;
  LY_ERR ret___2;
  lysp_stmt *child;
  undefined8 *puStack_50;
  LY_ERR ret___1;
  char *p__;
  LY_ERR ret__;
  lysp_qname *item;
  lysp_ext_instance **exts_local;
  yang_arg arg_local;
  lysp_qname **qnames_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,arg,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (*qnames == (lysp_qname *)0x0) {
      puStack_50 = (undefined8 *)malloc(0x20);
      if (puStack_50 == (undefined8 *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_78 = (ly_ctx *)0x0;
        }
        else {
          local_78 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_78,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_qnames");
        return LY_EMEM;
      }
      *puStack_50 = 1;
    }
    else {
      *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + 1;
      puStack_50 = (undefined8 *)
                   realloc(&(*qnames)[-1].flags,*(long *)&(*qnames)[-1].flags * 0x18 + 8);
      if (puStack_50 == (undefined8 *)0x0) {
        *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
        if (ctx == (lysp_ctx *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_70,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_qnames");
        return LY_EMEM;
      }
    }
    *qnames = (lysp_qname *)(puStack_50 + 1);
    str_p = *qnames + *(long *)&(*qnames)[-1].flags + -1;
    memset(str_p,0,0x18);
    if (ctx == (lysp_ctx *)0x0) {
      local_80 = (ly_ctx *)0x0;
    }
    else {
      local_80 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ctx_local._4_4_ = lydict_insert(local_80,stmt->arg,0,&str_p->str);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      str_p->mod = (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      for (plStack_60 = stmt->child; plStack_60 != (lysp_stmt *)0x0; plStack_60 = plStack_60->next)
      {
        if (plStack_60->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            local_a8 = (ly_ctx *)0x0;
          }
          else {
            local_a8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar2 = lyplg_ext_stmt2str(plStack_60->kw);
          pcVar3 = lyplg_ext_stmt2str(stmt->kw);
          ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,pcVar3);
          return LY_EVALID;
        }
        if (*qnames == (lysp_qname *)0x0) {
          local_a0 = 0;
        }
        else {
          local_a0 = *(long *)&(*qnames)[-1].flags;
        }
        LVar1 = lysp_stmt_ext(ctx,plStack_60,stmt->kw,local_a0 - 1,exts);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_qnames(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    struct lysp_qname *item;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, arg, stmt->arg));

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &item->str));
    item->mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}